

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  saslprogress local_34;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  saslprogress progress;
  pop3_conn *pop3c;
  connectdata *conn;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pop3c = (pop3_conn *)data->conn;
  paStack_30 = &((connectdata *)pop3c)->proto;
  local_18 = instate;
  result = pop3code;
  _instate_local = data;
  conn._4_4_ = Curl_sasl_continue((SASL *)&(((connectdata *)pop3c)->proto).imapc.sasl.authmechs,data
                                  ,pop3code,&local_34);
  if (conn._4_4_ == CURLE_OK) {
    if (local_34 == SASL_IDLE) {
      if (((paStack_30->pop3c).authtypes & (paStack_30->pop3c).preftype & 2) == 0) {
        if (((paStack_30->pop3c).authtypes & (paStack_30->pop3c).preftype & 1) == 0) {
          Curl_failf(_instate_local,"Authentication cancelled");
          conn._4_4_ = CURLE_LOGIN_DENIED;
        }
        else {
          conn._4_4_ = pop3_perform_user(_instate_local,(connectdata *)pop3c);
        }
      }
      else {
        conn._4_4_ = pop3_perform_apop(_instate_local,(connectdata *)pop3c);
      }
    }
    else if (local_34 == SASL_DONE) {
      pop3_state(_instate_local,POP3_STOP);
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_resp(struct Curl_easy *data,
                                     int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress;

  (void)instate; /* no use for this yet */

  result = Curl_sasl_continue(&pop3c->sasl, data, pop3code, &progress);
  if(!result)
    switch(progress) {
    case SASL_DONE:
      pop3_state(data, POP3_STOP);  /* Authenticated */
      break;
    case SASL_IDLE:            /* No mechanism left after cancellation */
#ifndef CURL_DISABLE_DIGEST_AUTH
      if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
        /* Perform APOP authentication */
        result = pop3_perform_apop(data, conn);
      else
#endif
      if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
        /* Perform clear text authentication */
        result = pop3_perform_user(data, conn);
      else {
        failf(data, "Authentication cancelled");
        result = CURLE_LOGIN_DENIED;
      }
      break;
    default:
      break;
    }

  return result;
}